

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O3

void recff_bit_nary(jit_State *J,RecordFFData *rd)

{
  uint32_t uVar1;
  int iVar2;
  TRef TVar3;
  TRef TVar4;
  TRef *pTVar5;
  ulong uVar6;
  
  iVar2 = recff_bit64_nary(J,rd);
  if (iVar2 == 0) {
    TVar3 = lj_opt_narrow_tobit(J,*J->base);
    pTVar5 = J->base;
    TVar4 = pTVar5[1];
    if (TVar4 != 0) {
      uVar1 = rd->data;
      uVar6 = 2;
      do {
        TVar4 = lj_opt_narrow_tobit(J,TVar4);
        (J->fold).ins.field_0.ot = (ushort)(uVar1 << 8) | 0x13;
        (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
        (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
        TVar3 = lj_opt_fold(J);
        pTVar5 = J->base;
        TVar4 = pTVar5[uVar6];
        uVar6 = (ulong)((int)uVar6 + 1);
      } while (TVar4 != 0);
    }
    *pTVar5 = TVar3;
  }
  return;
}

Assistant:

static void LJ_FASTCALL recff_bit_nary(jit_State *J, RecordFFData *rd)
{
#if LJ_HASFFI
  if (recff_bit64_nary(J, rd))
    return;
#endif
  {
    TRef tr = lj_opt_narrow_tobit(J, J->base[0]);
    uint32_t ot = IRTI(rd->data);
    BCReg i;
    for (i = 1; J->base[i] != 0; i++)
      tr = emitir(ot, tr, lj_opt_narrow_tobit(J, J->base[i]));
    J->base[0] = tr;
  }
}